

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O2

Point webrtc::CrossProduct(Point *a,Point *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Point PVar5;
  
  fVar1 = (float)*(undefined8 *)(a->c + 1);
  fVar2 = (float)((ulong)*(undefined8 *)(a->c + 1) >> 0x20);
  fVar3 = (float)*(undefined8 *)(b->c + 1);
  fVar4 = (float)((ulong)*(undefined8 *)(b->c + 1) >> 0x20);
  PVar5.c[0] = fVar4 * fVar1 - fVar2 * fVar3;
  PVar5.c[1] = b->c[0] * fVar2 - a->c[0] * fVar4;
  PVar5.c[2] = a->c[0] * fVar3 - b->c[0] * fVar1;
  return (Point)PVar5.c;
}

Assistant:

T y() const { return c[1]; }